

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceMemoryProperties2
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkMemoryHeapFlags *pMemoryProperties;
  RefData<vk::VkInstance_s_*> data;
  VkAllocationCallbacks *platformInterface;
  deBool dVar1;
  int iVar2;
  VkInstance_s **ppVVar3;
  size_type sVar4;
  const_reference ppVVar5;
  TestError *pTVar6;
  allocator<char> local_661;
  string local_660;
  undefined1 local_640 [8];
  VkPhysicalDeviceMemoryProperties2KHR extProperties;
  VkPhysicalDeviceMemoryProperties coreProperties;
  size_t deviceNdx;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_68;
  RefData<vk::VkInstance_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  Context *context_local;
  
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_68,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
  data.deleter.m_destroyInstance = local_50.deleter.m_destroyInstance;
  data.object = local_50.object;
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_38,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_68);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (PlatformInterface *)platformInterface,*ppVVar3);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx,
             (InstanceInterface *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar3);
  coreProperties.memoryHeaps[0xf].flags = 0;
  coreProperties.memoryHeaps[0xf]._12_4_ = 0;
  do {
    sVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)&deviceNdx);
    if (sVar4 <= (ulong)coreProperties.memoryHeaps[0xf]._8_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_660,"Querying device memory properties succeeded",&local_661);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_660);
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator(&local_661);
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &deviceNdx);
      ::vk::InstanceDriver::~InstanceDriver
                ((InstanceDriver *)
                 &devices.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_38);
      return __return_storage_ptr__;
    }
    pMemoryProperties = &extProperties.memoryProperties.memoryHeaps[0xf].flags;
    ::deMemset(pMemoryProperties,0xcd,0x208);
    ::deMemset(local_640,0xcd,0x218);
    local_640._0_4_ = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR;
    extProperties.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    extProperties._4_4_ = 0;
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreProperties.memoryHeaps[0xf]._8_8_);
    ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceMemoryProperties *)pMemoryProperties);
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreProperties.memoryHeaps[0xf]._8_8_);
    ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties2KHR
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceMemoryProperties2KHR *)local_640);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) ||
         (local_640._0_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,
                   "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x952);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (extProperties._0_8_ != 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"extProperties.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x953);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    iVar2 = deMemCmp(&extProperties.memoryProperties.memoryHeaps[0xf].flags,&extProperties.pNext,
                     0x208);
    if (iVar2 != 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x956);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    coreProperties.memoryHeaps[0xf]._8_8_ = coreProperties.memoryHeaps[0xf]._8_8_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus deviceMemoryProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceMemoryProperties		coreProperties;
		VkPhysicalDeviceMemoryProperties2KHR	extProperties;

		deMemset(&coreProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties));
		deMemset(&extProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties2KHR));

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceMemoryProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceMemoryProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		if (deMemCmp(&coreProperties, &extProperties.memoryProperties, sizeof(VkPhysicalDeviceMemoryProperties)) != 0)
			TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR");
	}

	return tcu::TestStatus::pass("Querying device memory properties succeeded");
}